

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O2

fornode * newfor(int type,void *a,void *b,void *c,void *statement)

{
  fornode *pfVar1;
  
  pfVar1 = (fornode *)smalloc(0x28);
  pfVar1->type = type;
  pfVar1->a = a;
  pfVar1->b = b;
  pfVar1->c = c;
  pfVar1->statement = statement;
  return pfVar1;
}

Assistant:

struct fornode *newfor(int type,void *a,void *b,void *c,void *statement)
{
	
	struct fornode *ptr;
	
	ptr=smalloc(sizeof(struct fornode));
	ptr->type=type;
	ptr->a=a;
	ptr->b=b;
	ptr->c=c;
	ptr->statement=statement;
	
	return ptr;
	
}